

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::attDef
          (AbstractDOMParser *this,DTDElementDecl *elemDecl,DTDAttDef *attDef,bool param_3)

{
  short *psVar1;
  DefAttTypes DVar2;
  XMLCh *pXVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  XMLSize_t i;
  long lVar8;
  undefined1 *puVar9;
  XMLBuffer *pXVar10;
  XMLBuffer *pXVar11;
  long lVar12;
  XMLCh XVar13;
  
  bVar4 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (!bVar4) {
    return;
  }
  iVar5 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])(elemDecl);
  if ((char)iVar5 == '\0') {
    return;
  }
  pXVar11 = this->fInternalSubset;
  iVar5 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(attDef);
  XMLBuffer::append(pXVar11,(XMLCh *)CONCAT44(extraout_var,iVar5));
  switch((attDef->super_XMLAttDef).fType) {
  case AttTypes_Min:
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    pXVar10 = pXVar11;
    if (XVar6 == pXVar11->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
      pXVar10 = this->fInternalSubset;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L' ';
    puVar9 = XMLUni::fgCDATAString;
    break;
  case ID:
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    pXVar10 = pXVar11;
    if (XVar6 == pXVar11->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
      pXVar10 = this->fInternalSubset;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L' ';
    puVar9 = (undefined1 *)0x35b2b8;
    break;
  case IDRef:
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    pXVar10 = pXVar11;
    if (XVar6 == pXVar11->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
      pXVar10 = this->fInternalSubset;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L' ';
    puVar9 = XMLUni::fgIDRefString;
    break;
  case IDRefs:
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    pXVar10 = pXVar11;
    if (XVar6 == pXVar11->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
      pXVar10 = this->fInternalSubset;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L' ';
    puVar9 = XMLUni::fgIDRefsString;
    break;
  case Entity:
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    pXVar10 = pXVar11;
    if (XVar6 == pXVar11->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
      pXVar10 = this->fInternalSubset;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L' ';
    puVar9 = (undefined1 *)0x35b12e;
    break;
  case Entities:
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    pXVar10 = pXVar11;
    if (XVar6 == pXVar11->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
      pXVar10 = this->fInternalSubset;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L' ';
    puVar9 = XMLUni::fgEntitiesString;
    break;
  case NmToken:
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    pXVar10 = pXVar11;
    if (XVar6 == pXVar11->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
      pXVar10 = this->fInternalSubset;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L' ';
    puVar9 = XMLUni::fgNmTokenString;
    break;
  case NmTokens:
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    pXVar10 = pXVar11;
    if (XVar6 == pXVar11->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
      pXVar10 = this->fInternalSubset;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L' ';
    puVar9 = XMLUni::fgNmTokensString;
    break;
  case Notation:
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    pXVar10 = pXVar11;
    if (XVar6 == pXVar11->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
      pXVar10 = this->fInternalSubset;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L' ';
    puVar9 = (undefined1 *)0x35b430;
    break;
  case Enumeration:
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    if (XVar6 == pXVar11->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L' ';
    pXVar3 = (attDef->super_XMLAttDef).fEnumeration;
    if (pXVar3 != (XMLCh *)0x0) {
      lVar12 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + lVar12);
        lVar12 = lVar12 + 2;
      } while (*psVar1 != 0);
      if (lVar12 >> 1 != 1) {
        XMLBuffer::append(this->fInternalSubset,L'(');
        lVar8 = 0;
        do {
          pXVar11 = this->fInternalSubset;
          XVar6 = pXVar11->fIndex;
          XVar13 = pXVar3[lVar8];
          if (pXVar3[lVar8] == L' ') {
            XVar13 = L'|';
          }
          if (XVar6 == pXVar11->fCapacity) {
            XMLBuffer::ensureCapacity(pXVar11,1);
            XVar6 = pXVar11->fIndex;
          }
          pXVar11->fIndex = XVar6 + 1;
          pXVar11->fBuffer[XVar6] = XVar13;
          lVar8 = lVar8 + 1;
        } while ((lVar12 >> 1) + -1 != lVar8);
        XMLBuffer::append(this->fInternalSubset,L')');
      }
    }
  default:
    goto switchD_002d700b_default;
  }
  XMLBuffer::append(pXVar10,(XMLCh *)puVar9);
switchD_002d700b_default:
  DVar2 = (attDef->super_XMLAttDef).fDefaultType;
  if (DVar2 == Fixed) {
    pXVar10 = this->fInternalSubset;
    XVar6 = pXVar10->fIndex;
    pXVar11 = pXVar10;
    if (XVar6 == pXVar10->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar10,1);
      XVar6 = pXVar10->fIndex;
      pXVar11 = this->fInternalSubset;
    }
    pXVar10->fIndex = XVar6 + 1;
    pXVar10->fBuffer[XVar6] = L' ';
    puVar9 = XMLUni::fgFixedString;
  }
  else if (DVar2 == Implied) {
    pXVar10 = this->fInternalSubset;
    XVar6 = pXVar10->fIndex;
    pXVar11 = pXVar10;
    if (XVar6 == pXVar10->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar10,1);
      XVar6 = pXVar10->fIndex;
      pXVar11 = this->fInternalSubset;
    }
    pXVar10->fIndex = XVar6 + 1;
    pXVar10->fBuffer[XVar6] = L' ';
    puVar9 = XMLUni::fgImpliedString;
  }
  else {
    if (DVar2 != Required) goto LAB_002d7450;
    pXVar10 = this->fInternalSubset;
    XVar6 = pXVar10->fIndex;
    pXVar11 = pXVar10;
    if (XVar6 == pXVar10->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar10,1);
      XVar6 = pXVar10->fIndex;
      pXVar11 = this->fInternalSubset;
    }
    pXVar10->fIndex = XVar6 + 1;
    pXVar10->fBuffer[XVar6] = L' ';
    puVar9 = XMLUni::fgRequiredString;
  }
  XMLBuffer::append(pXVar11,(XMLCh *)puVar9);
LAB_002d7450:
  pXVar3 = (attDef->super_XMLAttDef).fValue;
  if (pXVar3 != (XMLCh *)0x0) {
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    XVar7 = pXVar11->fCapacity;
    pXVar10 = pXVar11;
    if (XVar6 == XVar7) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
      pXVar10 = this->fInternalSubset;
      XVar7 = pXVar10->fCapacity;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L' ';
    XVar6 = pXVar10->fIndex;
    pXVar11 = pXVar10;
    if (XVar6 == XVar7) {
      XMLBuffer::ensureCapacity(pXVar10,1);
      XVar6 = pXVar10->fIndex;
      pXVar11 = this->fInternalSubset;
    }
    pXVar10->fIndex = XVar6 + 1;
    pXVar10->fBuffer[XVar6] = L'\"';
    XMLBuffer::append(pXVar11,pXVar3);
    pXVar11 = this->fInternalSubset;
    XVar6 = pXVar11->fIndex;
    if (XVar6 == pXVar11->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar11,1);
      XVar6 = pXVar11->fIndex;
    }
    pXVar11->fIndex = XVar6 + 1;
    pXVar11->fBuffer[XVar6] = L'\"';
  }
  return;
}

Assistant:

void AbstractDOMParser::attDef
(
    const   DTDElementDecl&     elemDecl
    , const DTDAttDef&          attDef
    , const bool
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        if (elemDecl.hasAttDefs())
        {
            fInternalSubset.append(attDef.getFullName());

            // Get the type and display it
            const XMLAttDef::AttTypes type = attDef.getType();
            switch(type)
            {
            case XMLAttDef::CData :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgCDATAString);
                break;
            case XMLAttDef::ID :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDString);
                break;
            case XMLAttDef::IDRef :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDRefString);
                break;
            case XMLAttDef::IDRefs :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDRefsString);
                break;
            case XMLAttDef::Entity :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgEntityString);
                break;
            case XMLAttDef::Entities :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgEntitiesString);
                break;
            case XMLAttDef::NmToken :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNmTokenString);
                break;
            case XMLAttDef::NmTokens :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNmTokensString);
                break;

            case XMLAttDef::Notation :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNotationString);
                break;

            case XMLAttDef::Enumeration :
                {
                    fInternalSubset.append(chSpace);
                    const XMLCh* enumString = attDef.getEnumeration();
                    XMLSize_t length = XMLString::stringLen(enumString);
                    if (length > 0) {

                        fInternalSubset.append(chOpenParen );
                        for(XMLSize_t i=0; i<length; i++) {
                            if (enumString[i] == chSpace)
                                fInternalSubset.append(chPipe);
                            else
                                fInternalSubset.append(enumString[i]);
                        }
                        fInternalSubset.append(chCloseParen);
                    }
                }
                break;
            default:
                // remaining types don't belong to a DTD
                break;
            }
            //get te default types of the attlist
            const XMLAttDef::DefAttTypes def = attDef.getDefaultType();
            switch(def)
            {
            case XMLAttDef::Required :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgRequiredString);
                break;
            case XMLAttDef::Implied :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgImpliedString);
                break;
            case XMLAttDef::Fixed :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgFixedString);
                break;
            default:
                // remaining types don't belong to a DTD
                break;
            }

            const XMLCh* defaultValue = attDef.getValue();
            if (defaultValue != 0) {
                fInternalSubset.append(chSpace);
                fInternalSubset.append(chDoubleQuote);
                fInternalSubset.append(defaultValue);
                fInternalSubset.append(chDoubleQuote);
            }
        }
    }
}